

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::GzipOutputStream::Init
          (GzipOutputStream *this,ZeroCopyOutputStream *sub_stream,Options *options)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  uint local_60;
  int windowBitsFormat;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  Options *local_20;
  Options *options_local;
  ZeroCopyOutputStream *sub_stream_local;
  GzipOutputStream *this_local;
  
  this->sub_stream_ = sub_stream;
  this->sub_data_ = (void *)0x0;
  this->sub_data_size_ = 0;
  this->input_buffer_length_ = (long)options->buffer_size;
  local_20 = options;
  options_local = (Options *)sub_stream;
  sub_stream_local = &this->super_ZeroCopyOutputStream;
  pvVar2 = operator_new(this->input_buffer_length_);
  this->input_buffer_ = pvVar2;
  if (this->input_buffer_ != (void *)0x0) {
    (this->zcontext_).zalloc = (alloc_func)0x0;
    (this->zcontext_).zfree = (free_func)0x0;
    (this->zcontext_).opaque = (voidpf)0x0;
    (this->zcontext_).next_out = (Bytef *)0x0;
    (this->zcontext_).avail_out = 0;
    (this->zcontext_).total_out = 0;
    (this->zcontext_).next_in = (Bytef *)0x0;
    (this->zcontext_).avail_in = 0;
    (this->zcontext_).total_in = 0;
    (this->zcontext_).msg = (char *)0x0;
    local_60 = 0x10;
    if (local_20->format == ZLIB) {
      local_60 = 0;
    }
    iVar1 = deflateInit2_(&this->zcontext_,local_20->compression_level,8,local_60 | 0xf,8,
                          local_20->compression_strategy,"1.2.11",0x70);
    this->zerror_ = iVar1;
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"input_buffer_ != NULL");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
             ,0xc9,local_48._M_len,local_48._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

void GzipOutputStream::Init(ZeroCopyOutputStream* sub_stream,
                            const Options& options) {
  sub_stream_ = sub_stream;
  sub_data_ = NULL;
  sub_data_size_ = 0;

  input_buffer_length_ = options.buffer_size;
  input_buffer_ = operator new(input_buffer_length_);
  ABSL_CHECK(input_buffer_ != NULL);

  zcontext_.zalloc = Z_NULL;
  zcontext_.zfree = Z_NULL;
  zcontext_.opaque = Z_NULL;
  zcontext_.next_out = NULL;
  zcontext_.avail_out = 0;
  zcontext_.total_out = 0;
  zcontext_.next_in = NULL;
  zcontext_.avail_in = 0;
  zcontext_.total_in = 0;
  zcontext_.msg = NULL;
  // default to GZIP format
  int windowBitsFormat = 16;
  if (options.format == ZLIB) {
    windowBitsFormat = 0;
  }
  zerror_ =
      deflateInit2(&zcontext_, options.compression_level, Z_DEFLATED,
                   /* windowBits */ 15 | windowBitsFormat,
                   /* memLevel (default) */ 8, options.compression_strategy);
}